

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lj_ccall.c
# Opt level: O2

int lj_ccall_func(lua_State *L,GCcdata *cd)

{
  CTSize *pCVar1;
  long *plVar2;
  ushort uVar3;
  CTSize CVar4;
  int iVar5;
  uint uVar6;
  void *pvVar7;
  ulong uVar8;
  ulong uVar9;
  TValue *pTVar10;
  uint uVar11;
  uint uVar12;
  CTState *cts;
  long lVar13;
  uint uVar14;
  uint uVar15;
  CType *pCVar16;
  FPRArg *pFVar17;
  int iVar18;
  TValue *pTVar19;
  uint uVar20;
  GPRArg *dp;
  byte bVar21;
  CType *pCVar22;
  uint uVar23;
  CType *pCVar24;
  ulong local_248;
  uint local_230 [2];
  int rcl [2];
  FPRArg *local_208;
  CCallState cc;
  
  cts = (CTState *)(ulong)*(uint *)((ulong)(L->glref).ptr32 + 0x194);
  cts->L = L;
  pCVar16 = cts->tab;
  uVar12 = pCVar16[cd->ctypeid].info;
  pCVar24 = pCVar16 + cd->ctypeid;
  if ((uVar12 & 0xf0000000) == 0x20000000) {
    pCVar1 = &pCVar24->size;
    uVar9 = (ulong)((uVar12 & 0xffff) << 4);
    uVar12 = *(uint *)((long)&pCVar16->info + uVar9);
    if ((uVar12 & 0xf0000000) != 0x60000000) {
      return -1;
    }
    pCVar24 = (CType *)((long)&pCVar16->info + uVar9);
    if (*pCVar1 != 4) goto LAB_0014a332;
    cc.func._4_1_ = '\0';
    cc.func._5_1_ = '\0';
    cc.func._6_2_ = 0;
    cc.func._0_4_ = cd[1].nextgc.gcptr32;
  }
  else {
    if ((uVar12 & 0xf0000000) != 0x60000000) {
      return -1;
    }
LAB_0014a332:
    cc.func = *(_func_void **)(cd + 1);
  }
  pTVar10 = L->top;
  memset(cc.fpr,0,0xb0);
  uVar9 = (ulong)((uVar12 & 0xffff) << 4);
  uVar20 = *(uint *)((long)&pCVar16->info + uVar9);
  pCVar16 = (CType *)((long)&pCVar16->info + uVar9);
  if ((uVar20 & 0xf8000000) == 0x38000000) {
    local_248 = 0;
    if ((pCVar16->size != 8) && (pCVar16->size != 0x10)) {
LAB_0014a3ad:
      lj_err_caller(L,LJ_ERR_FFI_NYICALL);
    }
  }
  else {
    local_248 = 0;
    if ((uVar20 & 0xf4000000) == 0x34000000 || (uVar20 & 0xf0000000) == 0x10000000) {
      pvVar7 = lj_mem_newgco(L,pCVar16->size + 8);
      *(undefined1 *)((long)pvVar7 + 5) = 10;
      *(short *)((long)pvVar7 + 6) = (short)uVar12;
      plVar2 = (long *)((ulong)(cts->L->glref).ptr32 + 0xe0);
      *plVar2 = *plVar2 + 1;
      pTVar19 = L->top;
      L->top = pTVar19 + 1;
      (pTVar19->u32).lo = (uint32_t)pvVar7;
      (pTVar19->field_2).it = 0xfffffff5;
      if ((pCVar16->info & 0xf0000000) == 0x10000000) {
        rcl[0] = 0;
        rcl[1] = 0;
        iVar18 = ccall_classify_struct(cts,pCVar16,rcl,0);
        cc.retref = iVar18 != 0;
        if ((bool)cc.retref) {
          cc.gpr[0] = (long)pvVar7 + 8;
        }
        local_248 = (ulong)cc.retref;
      }
      else {
        cc.retref = '\0';
      }
    }
  }
  uVar20 = (uint)pCVar24->sib;
  pTVar19 = L->base;
  iVar18 = 1;
  uVar9 = 0;
  uVar12 = 0;
  while( true ) {
    pTVar19 = pTVar19 + 1;
    if (pTVar10 <= pTVar19) break;
    if (uVar20 == 0) {
      if ((pCVar24->info & 0x800000) == 0) goto LAB_0014aaeb;
      uVar6 = lj_ccall_ctid_vararg(cts,pTVar19);
      pCVar16 = cts->tab;
      uVar20 = 0;
    }
    else {
      pCVar16 = cts->tab;
      uVar6 = (uint)(ushort)pCVar16[uVar20].info;
      uVar20 = (uint)pCVar16[uVar20].sib;
    }
    uVar23 = (uint)uVar9;
    uVar11 = pCVar16[uVar6].info;
    pCVar16 = pCVar16 + uVar6;
    uVar6 = pCVar16->size;
    if (uVar11 < 0x10000000) {
      if (8 < uVar6) goto LAB_0014a3ad;
      uVar14 = uVar6 + 7 >> 3;
      uVar15 = uVar14;
      if ((uVar11 >> 0x1a & 1) == 0) goto LAB_0014a661;
      bVar21 = 0;
LAB_0014a641:
      if (uVar14 + uVar23 < 9) {
        dp = (GPRArg *)(cc.fpr[0].b + uVar9 * 0x10);
        uVar23 = uVar14 + uVar23;
      }
      else {
LAB_0014a68c:
        if (0x30000 < (pCVar16->info & 0xf0000)) {
          uVar6 = -1 << ((byte)(pCVar16->info + 0xd0000 >> 0x10) & 0xf);
          uVar12 = uVar12 + ~uVar6 & uVar6;
        }
        if (0x20 < uVar12 + uVar15) goto LAB_0014a3ad;
        dp = cc.stack + uVar12;
        uVar12 = uVar12 + uVar15;
      }
LAB_0014a6e6:
      lj_cconv_ct_tv(cts,pCVar16,(uint8_t *)dp,pTVar19,iVar18 << 8);
      if (((pCVar16->info & 0xf4000000) == 0) && (uVar6 = pCVar16->size, uVar6 < 4)) {
        if ((pCVar16->info >> 0x17 & 1) == 0) {
          if (uVar6 == 1) {
            uVar6 = (uint)(char)(byte)*dp;
          }
          else {
            uVar6 = (uint)(short)(ushort)*dp;
          }
        }
        else if (uVar6 == 1) {
          uVar6 = (uint)(byte)*dp;
        }
        else {
          uVar6 = (uint)(ushort)*dp;
        }
        *(uint *)dp = uVar6;
      }
      if (((bool)(bVar21 & uVar15 == 2)) &&
         (dp == (GPRArg *)(cc.fpr[0].b + (ulong)(uVar23 - 2) * 0x10))) {
        cc.fpr[uVar23 - 1].d[0] = (double)dp[1];
        dp[1] = 0;
      }
    }
    else {
      if ((uVar11 & 0xf8000000) == 0x38000000) {
        if ((uVar6 == 8) || (uVar6 == 0x10)) {
          bVar21 = 0;
          uVar14 = 1;
          uVar15 = uVar6 + 7 >> 3;
          goto LAB_0014a641;
        }
        goto LAB_0014a3ad;
      }
      if ((uVar11 & 0xf0000000) != 0x10000000) {
        uVar15 = 1;
        if ((uVar11 & 0xf4000000) == 0x34000000) {
          uVar14 = uVar6 + 7 >> 3;
          bVar21 = 1;
          uVar15 = uVar14;
          goto LAB_0014a641;
        }
LAB_0014a661:
        uVar6 = uVar15 + (int)local_248;
        if (6 < uVar6) {
          bVar21 = 0;
          goto LAB_0014a68c;
        }
        dp = cc.gpr + local_248;
        bVar21 = 0;
        local_248 = (ulong)uVar6;
        goto LAB_0014a6e6;
      }
      local_230[0] = 0;
      local_230[1] = 0;
      iVar5 = ccall_classify_struct(cts,pCVar16,(int *)local_230,0);
      if (iVar5 != 0) {
        uVar15 = uVar6 + 7 >> 3;
        if (uVar6 + 7 < 0x18) goto LAB_0014a661;
        bVar21 = 0;
        goto LAB_0014a68c;
      }
      cc.ngpr = (uint8_t)local_248;
      rcl[0] = 0;
      rcl[1] = 0;
      cc.nsp = (uint8_t)uVar12;
      cc.nfpr = (uint8_t)uVar9;
      lj_cconv_ct_tv(cts,pCVar16,(uint8_t *)rcl,pTVar19,iVar18 << 8);
      uVar9 = (ulong)cc.nfpr;
      local_248 = (ulong)cc.ngpr;
      for (lVar13 = 0; lVar13 != 2; lVar13 = lVar13 + 1) {
        if ((rcl[lVar13 + -2] & 1U) == 0) {
          uVar8 = local_248;
          if ((rcl[lVar13 + -2] & 2U) != 0) {
            if (7 < (uint)uVar9) goto LAB_0014a885;
            cc.fpr[uVar9].d[0] = *(double *)(rcl + lVar13 * 2);
            uVar9 = (ulong)((uint)uVar9 + 1);
          }
        }
        else {
          if (5 < (uint)local_248) {
LAB_0014a885:
            uVar9 = (ulong)cc.nsp;
            iVar5 = 2 - (uint)(local_230[1] == 0);
            uVar12 = iVar5 + (uint)cc.nsp;
            if (0x20 < uVar12) goto LAB_0014a3ad;
            cc.nsp = (uint8_t)uVar12;
            memcpy(cc.stack + uVar9,rcl,(ulong)(uint)(iVar5 * 8));
            local_248 = (ulong)cc.ngpr;
            uVar9 = (ulong)cc.nfpr;
            goto LAB_0014a8c8;
          }
          uVar8 = (ulong)((uint)local_248 + 1);
          cc.gpr[local_248] = *(GPRArg *)(rcl + lVar13 * 2);
        }
        local_248 = uVar8;
      }
      cc.ngpr = (uint8_t)local_248;
      cc.nfpr = (uint8_t)uVar9;
LAB_0014a8c8:
      uVar12 = (uint)cc.nsp;
      local_248 = local_248 & 0xff;
      uVar23 = (uint)(byte)uVar9;
    }
    iVar18 = iVar18 + 1;
    uVar9 = (ulong)uVar23;
  }
  if (uVar20 != 0) {
LAB_0014aaeb:
    lj_err_caller(L,LJ_ERR_FFI_NUMARG);
  }
  cc.spadj = 8;
  if (1 < uVar12) {
    cc.spadj = uVar12 * 8 | 8;
  }
  pCVar16 = cts->tab;
  (cts->cb).slot = 0xffffffff;
  cc.nsp = (uint8_t)uVar12;
  cc.nfpr = (uint8_t)uVar9;
  lj_vm_ffi_call();
  if ((cts->cb).slot != 0xffffffff) {
    rcl = (int  [2])((ulong)cc.func >> 2);
    pTVar10 = lj_tab_set(L,cts->miscmap,(cTValue *)rcl);
    (pTVar10->field_2).it = 0xfffffffd;
  }
  pCVar22 = cts->tab;
  uVar3 = *(ushort *)(((long)pCVar24 - (long)pCVar16) + (long)pCVar22);
  uVar12 = pCVar22[uVar3].info;
  if ((uVar12 & 0xf0000000) == 0x40000000) {
    iVar18 = 0;
    iVar5 = 0;
    goto LAB_0014aab7;
  }
  pCVar22 = pCVar22 + uVar3;
  if ((uVar12 & 0xf0000000) == 0x10000000) {
    if (cc.retref == '\0') {
      uVar12 = L->top[-1].u32.lo;
      local_230[0] = 0;
      local_230[1] = 0;
      ccall_classify_struct(cts,pCVar22,(int *)local_230,0);
      uVar20 = pCVar22->size;
      uVar6 = 0;
      uVar11 = 0;
      for (lVar13 = 0; lVar13 != 2; lVar13 = lVar13 + 1) {
        if ((rcl[lVar13 + -2] & 1U) == 0) {
          if ((rcl[lVar13 + -2] & 2U) != 0) {
            uVar9 = (ulong)uVar11;
            uVar11 = uVar11 + 1;
            pFVar17 = cc.fpr + uVar9;
            goto LAB_0014aa19;
          }
        }
        else {
          uVar9 = (ulong)uVar6;
          uVar6 = uVar6 + 1;
          pFVar17 = (FPRArg *)(cc.gpr + uVar9);
LAB_0014aa19:
          *(double *)(rcl + lVar13 * 2) = pFVar17->d[0];
        }
      }
      memcpy((void *)((ulong)uVar12 + 8),rcl,(ulong)uVar20);
    }
LAB_0014aa84:
    iVar18 = 1;
    iVar5 = 1;
  }
  else {
    if ((uVar12 & 0xf4000000) == 0x4000000) {
LAB_0014aa95:
      local_208 = cc.fpr;
    }
    else {
      if ((uVar12 & 0xf4000000) == 0x34000000) {
        CVar4 = pCVar22->size;
        uVar9 = (ulong)L->top[-1].u32.lo;
        *(double *)(uVar9 + 8) = cc.fpr[0].d[0];
        if (CVar4 != 8) {
          *(double *)(uVar9 + 0x10) = cc.fpr[1].d[0];
        }
        goto LAB_0014aa84;
      }
      local_208 = (FPRArg *)cc.gpr;
      if ((uVar12 & 0xf8000000) == 0x38000000) goto LAB_0014aa95;
    }
    iVar5 = lj_cconv_tv_ct(cts,pCVar22,0,L->top + -1,local_208->b);
    iVar18 = 1;
  }
LAB_0014aab7:
  for (; 0 < iVar5; iVar5 = iVar5 + -1) {
    uVar9 = (ulong)(L->glref).ptr32;
    if (*(uint *)(uVar9 + 0x54) <= *(uint *)(uVar9 + 0x50)) {
      lj_gc_step(L);
    }
  }
  return iVar18;
}

Assistant:

int lj_ccall_func(lua_State *L, GCcdata *cd)
{
  CTState *cts = ctype_cts(L);
  CType *ct = ctype_raw(cts, cd->ctypeid);
  CTSize sz = CTSIZE_PTR;
  if (ctype_isptr(ct->info)) {
    sz = ct->size;
    ct = ctype_rawchild(cts, ct);
  }
  if (ctype_isfunc(ct->info)) {
    CCallState cc;
    int gcsteps, ret;
    cc.func = (void (*)(void))cdata_getptr(cdataptr(cd), sz);
    gcsteps = ccall_set_args(L, cts, ct, &cc);
    ct = (CType *)((intptr_t)ct-(intptr_t)cts->tab);
    cts->cb.slot = ~0u;
    lj_vm_ffi_call(&cc);
    if (cts->cb.slot != ~0u) {  /* Blacklist function that called a callback. */
      TValue tv;
      tv.u64 = ((uintptr_t)(void *)cc.func >> 2) | U64x(800000000, 00000000);
      setboolV(lj_tab_set(L, cts->miscmap, &tv), 1);
    }
    ct = (CType *)((intptr_t)ct+(intptr_t)cts->tab);  /* May be reallocated. */
    gcsteps += ccall_get_results(L, cts, ct, &cc, &ret);
#if LJ_TARGET_X86 && LJ_ABI_WIN
    /* Automatically detect __stdcall and fix up C function declaration. */
    if (cc.spadj && ctype_cconv(ct->info) == CTCC_CDECL) {
      CTF_INSERT(ct->info, CCONV, CTCC_STDCALL);
      lj_trace_abort(G(L));
    }
#endif
    while (gcsteps-- > 0)
      lj_gc_check(L);
    return ret;
  }
  return -1;  /* Not a function. */
}